

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O3

HTTPAPIEX_HANDLE HTTPAPIEX_Create(char *hostName)

{
  HTTPAPIEX_HANDLE __ptr;
  STRING_HANDLE handle;
  VECTOR_HANDLE pVVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (hostName == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "invalid (NULL) parameter";
      iVar3 = 0x4f;
LAB_0016ddc3:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                ,"HTTPAPIEX_Create",iVar3,1,pcVar4);
      return (HTTPAPIEX_HANDLE)0x0;
    }
  }
  else {
    __ptr = (HTTPAPIEX_HANDLE)calloc(1,0x20);
    if (__ptr == (HTTPAPIEX_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "malloc failed.";
        iVar3 = 0x58;
        goto LAB_0016ddc3;
      }
    }
    else {
      handle = STRING_construct(hostName);
      __ptr->hostName = handle;
      if (handle == (STRING_HANDLE)0x0) {
        free(__ptr);
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar4 = "unable to STRING_construct";
          iVar3 = 0x62;
          goto LAB_0016ddc3;
        }
      }
      else {
        pVVar1 = VECTOR_create(0x10);
        __ptr->savedOptions = pVVar1;
        if (pVVar1 != (VECTOR_HANDLE)0x0) {
          __ptr->k = -1;
          return __ptr;
        }
        STRING_delete(handle);
        free(__ptr);
      }
    }
  }
  return (HTTPAPIEX_HANDLE)0x0;
}

Assistant:

HTTPAPIEX_HANDLE HTTPAPIEX_Create(const char* hostName)
{
    HTTPAPIEX_HANDLE result;
    /*Codes_SRS_HTTPAPIEX_02_001: [If parameter hostName is NULL then HTTPAPIEX_Create shall return NULL.]*/
    if (hostName == NULL)
    {
        LogError("invalid (NULL) parameter");
        result = NULL;
    }
    else
    {
        /*Codes_SRS_HTTPAPIEX_02_005: [If creating the handle fails for any reason, then HTTAPIEX_Create shall return NULL.] */
        HTTPAPIEX_HANDLE_DATA* handleData = (HTTPAPIEX_HANDLE_DATA*)calloc(1, sizeof(HTTPAPIEX_HANDLE_DATA));
        if (handleData == NULL)
        {
            LogError("malloc failed.");
            result = NULL;
        }
        else
        {
            /*Codes_SRS_HTTPAPIEX_02_002: [Parameter hostName shall be saved.]*/
            handleData->hostName = STRING_construct(hostName);
            if (handleData->hostName == NULL)
            {
                free(handleData);
                LogError("unable to STRING_construct");
                result = NULL;
            }
            else
            {
                /*Codes_SRS_HTTPAPIEX_02_004: [Otherwise, HTTPAPIEX_Create shall return a HTTAPIEX_HANDLE suitable for further calls to the module.] */
                handleData->savedOptions = VECTOR_create(sizeof(HTTPAPIEX_SAVED_OPTION));
                if (handleData->savedOptions == NULL)
                {
                    STRING_delete(handleData->hostName);
                    free(handleData);
                    result = NULL;
                }
                else
                {
                    handleData->k = -1;
                    handleData->httpHandle = NULL;
                    result = handleData;
                }
            }
        }
    }
    return result;
}